

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::ParseBigVarint(char *p,uint64_t *out)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  char *pnew;
  bool bVar5;
  
  uVar2 = (uint)(char)*(ushort *)p;
  uVar1 = (*(ushort *)p & uVar2) + uVar2;
  uVar4 = (ulong)(uVar1 >> 1);
  if ((short)uVar1 < 0) {
    lVar3 = 0xd;
    do {
      if (lVar3 == 0x45) {
        return (char *)0x0;
      }
      uVar2 = (uint)(char)*(ushort *)(p + 2);
      uVar1 = (*(ushort *)(p + 2) & uVar2) + uVar2;
      p = p + 2;
      uVar4 = uVar4 + ((ulong)uVar1 - 2 << ((byte)lVar3 & 0x3f));
      lVar3 = lVar3 + 0xe;
    } while ((short)uVar1 < 0);
    bVar5 = uVar1 < uVar2;
  }
  else {
    bVar5 = uVar1 < uVar2;
  }
  *out = uVar4;
  return p + (ulong)bVar5 + 1;
}

Assistant:

static uint16_t Load(const void* p) {
    uint16_t tmp;
    std::memcpy(&tmp, p, 2);
    return little_endian::ToHost(tmp);
  }